

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_string_class.cpp
# Opt level: O2

void string_constructors(void)

{
  ostream *poVar1;
  string five;
  string two;
  char list [22];
  string one;
  string six1;
  string four;
  string three;
  string seven;
  string six;
  string five1;
  
  std::__cxx11::string::string((string *)&one,"Lottery winner!",(allocator *)&two);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&one);
  std::endl<char,std::char_traits<char>>(poVar1);
}

Assistant:

void string_constructors() {
    using namespace std;

    // 1
    string one("Lottery winner!");

    //  has already some operator overloading...
    cout << one << endl;

    // 2. similar to Array(n).fill('x').join(''), lol
    string two(20, '$');
    cout << two << endl;

    // 3. copy constructor
    string three(one);
    cout << three << endl;

    one += " Oops!";
    cout << one << endl;

    two = "That is too bad...";
    three[0] = '$';

    // 4
    string four;
    four = two + three;
    cout << four << endl;

    //  5. similar to str = string.substr(0, n)
    //  for array, it is actually addresses...
    char list[] = "All I need is rest...";
    string five(list, 20);
    cout << five << endl;

    string five1(list, 5);
    cout << five1 << endl;

    // 6. similar to str = string.substr(a, b)
    string six(list + 6, list + 10);
    cout << six << endl;

    // five is string class, its operator[] is overloaded.
    string six1(&five[6], &five[10]);
    cout << six1 << endl;

    // 7. also string.substr(a, b)
    string seven(four, 7, 16);
    cout << seven << endl;
}